

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O1

bool_t ecpMOVIsMet(word *q,word *p,size_t n,size_t threshold,void *stack)

{
  word *b;
  int iVar1;
  
  b = (word *)((long)stack + n * 8);
  zzMod((word *)stack,p,n,q,n,b + n);
  wwCopy(b,(word *)stack,n);
  iVar1 = wwCmpW(b,n,1);
  while( true ) {
    if (iVar1 == 0) {
      return 0;
    }
    threshold = threshold - 1;
    if (threshold == 0) break;
    zzMulMod(b,b,(word *)stack,q,n,b + n);
    iVar1 = wwCmpW(b,n,1);
  }
  return 1;
}

Assistant:

bool_t ecpMOVIsMet(const word q[], const word p[], size_t n, 
	size_t threshold, void* stack)
{
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// t1, t2 <- p mod q
	ASSERT(threshold > 0);
	zzMod(t1, p, n, q, n, stack);
	wwCopy(t2, t1, n);
	// p mod q == 1?
	if (wwCmpW(t2, n, 1) == 0)
		return FALSE;
	while (--threshold)
	{
		// p^i mod q == 1?
		zzMulMod(t2, t2, t1, q, n, stack);
		if (wwCmpW(t2, n, 1) == 0)
			return FALSE;
	}
	return TRUE;
}